

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xc) = 2;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x18));
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  std::__cxx11::string::string((string *)(in_RDI + 0x58));
  std::__cxx11::string::string((string *)(in_RDI + 0x78));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b69e7);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            abortAfter( -1 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing )
        {}